

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::SetRegistrarHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  char cVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  Error *pEVar4;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  undefined1 local_188 [8];
  _Alloc_hider _Stack_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  code *local_160;
  writer write;
  string local_148;
  BbrDataset bbrDatasetWithRegAddr;
  BbrDataset bbrDataset;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  bbrDataset.mTriHostname._M_dataplus._M_p = (pointer)&bbrDataset.mTriHostname.field_2;
  bbrDataset.mTriHostname._M_string_length = 0;
  bbrDataset.mTriHostname.field_2._M_local_buf[0] = '\0';
  bbrDataset.mRegistrarHostname._M_dataplus._M_p = (pointer)&bbrDataset.mRegistrarHostname.field_2;
  bbrDataset.mRegistrarHostname._M_string_length = 0;
  bbrDataset.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  bbrDataset.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)&bbrDataset.mRegistrarIpv6Addr.field_2;
  bbrDataset.mRegistrarIpv6Addr._M_string_length = 0;
  bbrDataset.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  bbrDataset.mPresentFlags = 0;
  bbrDatasetWithRegAddr.mTriHostname._M_dataplus._M_p =
       (pointer)&bbrDatasetWithRegAddr.mTriHostname.field_2;
  bbrDatasetWithRegAddr.mTriHostname._M_string_length = 0;
  bbrDatasetWithRegAddr.mTriHostname.field_2._M_local_buf[0] = '\0';
  bbrDatasetWithRegAddr.mRegistrarHostname._M_dataplus._M_p =
       (pointer)&bbrDatasetWithRegAddr.mRegistrarHostname.field_2;
  bbrDatasetWithRegAddr.mRegistrarHostname._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  bbrDatasetWithRegAddr.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  bbrDatasetWithRegAddr.mRegistrarIpv6Addr._M_dataplus._M_p =
       (pointer)&bbrDatasetWithRegAddr.mRegistrarIpv6Addr.field_2;
  bbrDatasetWithRegAddr.mRegistrarIpv6Addr._M_string_length = 0;
  bbrDatasetWithRegAddr.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  bbrDatasetWithRegAddr.mPresentFlags = 0;
  std::__cxx11::string::_M_assign((string *)&bbrDataset.mRegistrarHostname);
  bbrDataset.mPresentFlags = bbrDataset.mPresentFlags | 0x4000;
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x16])(local_188);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_188);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_180);
  if (EVar2 == kNone) {
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Commissioner[0x18])(local_188,peVar3,&bbrDatasetWithRegAddr,0x2000);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_188);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&_Stack_180);
    if (EVar2 == kNone) {
      if ((bbrDatasetWithRegAddr.mPresentFlags & 0x2000) == 0) {
        local_188._0_4_ = string_type;
        _Stack_180._M_p = "cannot resolve the Registrar Hostname: {}";
        local_178 = 0x29;
        local_170._M_allocated_capacity = 0x100000000;
        local_160 = ::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        from = "cannot resolve the Registrar Hostname: {}";
        local_170._8_8_ = local_188;
        write.handler_ = (format_string_checker<char> *)local_188;
        while (from != "") {
          cVar1 = *from;
          to = from;
          while (cVar1 != '{') {
            to = to + 1;
            if (to == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&write,from,"");
              goto LAB_0014cc39;
            }
            cVar1 = *to;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,from,to);
          from = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (to,"",(format_string_checker<char> *)local_188);
        }
LAB_0014cc39:
        local_188 = (undefined1  [8])(aHostname->_M_dataplus)._M_p;
        _Stack_180._M_p = (pointer)aHostname->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x29;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_188;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_148,(v10 *)"cannot resolve the Registrar Hostname: {}",fmt,args);
        local_58._0_4_ = kBadFormat;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_148);
        Error::operator=(__return_storage_ptr__,(Error *)local_58);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        std::__cxx11::string::~string((string *)&local_148);
      }
      else {
        MergeDataset(&this->mBbrDataset,&bbrDataset);
        MergeDataset(&this->mBbrDataset,&bbrDatasetWithRegAddr);
      }
    }
  }
  BbrDataset::~BbrDataset(&bbrDatasetWithRegAddr);
  BbrDataset::~BbrDataset(&bbrDataset);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetRegistrarHostname(const std::string &aHostname)
{
    Error      error;
    BbrDataset bbrDataset;
    BbrDataset bbrDatasetWithRegAddr;

    bbrDataset.mRegistrarHostname = aHostname;
    bbrDataset.mPresentFlags |= BbrDataset::kRegistrarHostnameBit;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(bbrDataset));
    SuccessOrExit(error = mCommissioner->GetBbrDataset(bbrDatasetWithRegAddr, BbrDataset::kRegistrarIpv6AddrBit));
    VerifyOrExit(bbrDatasetWithRegAddr.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit,
                 error = ERROR_BAD_FORMAT("cannot resolve the Registrar Hostname: {}", aHostname));

    MergeDataset(mBbrDataset, bbrDataset);
    MergeDataset(mBbrDataset, bbrDatasetWithRegAddr);

exit:
    return error;
}